

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  Vdbe *p;
  sqlite3 *db_00;
  i16 iVar1;
  int iVar2;
  uint p4;
  int iVar3;
  Upsert *pUpsert_00;
  Index *pIVar4;
  SrcList *pTabList;
  ExprList *pChanges;
  Expr *pWhere;
  int k;
  int iPk;
  int nPk;
  Index *pPk;
  int regRowid;
  Upsert *pTop;
  int i;
  int iDataCur;
  SrcList *pSrc;
  sqlite3 *db;
  Vdbe *v;
  int iCur_local;
  Index *pIdx_local;
  Table *pTab_local;
  Upsert *pUpsert_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  db_00 = pParse->db;
  iVar3 = pUpsert->iDataCur;
  pUpsert_00 = sqlite3UpsertOfIndex(pUpsert,pIdx);
  if ((pIdx != (Index *)0x0) && (iCur != iVar3)) {
    if ((pTab->tabFlags & 0x80) == 0) {
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x8e,iCur,iVar2);
      sqlite3VdbeAddOp3(p,0x1e,iVar3,0,iVar2);
      sqlite3ReleaseTempReg(pParse,iVar2);
    }
    else {
      pIVar4 = sqlite3PrimaryKeyIndex(pTab);
      p4 = (uint)pIVar4->nKeyCol;
      iVar2 = pParse->nMem + 1;
      pParse->nMem = p4 + pParse->nMem;
      for (pTop._0_4_ = 0; (int)pTop < (int)p4; pTop._0_4_ = (int)pTop + 1) {
        iVar1 = sqlite3TableColumnToIndex(pIdx,pIVar4->aiColumn[(int)pTop]);
        sqlite3VdbeAddOp3(p,0x5e,iCur,(int)iVar1,iVar2 + (int)pTop);
      }
      iVar3 = sqlite3VdbeAddOp4Int(p,0x1d,iVar3,0,iVar2,p4);
      sqlite3VdbeAddOp4(p,0x46,0xb,2,0,"corrupt database",-1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeJumpHere(p,iVar3);
    }
  }
  pTabList = sqlite3SrcListDup(db_00,pUpsert->pUpsertSrc,0);
  for (pTop._0_4_ = 0; (int)pTop < pTab->nCol; pTop._0_4_ = (int)pTop + 1) {
    if (pTab->aCol[(int)pTop].affinity == 'E') {
      sqlite3VdbeAddOp1(p,0x57,pUpsert->regData + (int)pTop);
    }
  }
  pChanges = sqlite3ExprListDup(db_00,pUpsert_00->pUpsertSet,0);
  pWhere = sqlite3ExprDup(db_00,pUpsert_00->pUpsertWhere,0);
  sqlite3Update(pParse,pTabList,pChanges,pWhere,2,(ExprList *)0x0,(Expr *)0x0,pUpsert_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;
  int i;
  Upsert *pTop = pUpsert;

  assert( v!=0 );
  assert( pUpsert!=0 );
  iDataCur = pUpsert->iDataCur;
  pUpsert = sqlite3UpsertOfIndex(pTop, pIdx);
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zCnName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0,
            "corrupt database", P4_STATIC);
      sqlite3MayAbort(pParse);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pTop->pUpsertSrc - the outer INSERT statement does.
  ** So we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pTop->pUpsertSrc, 0);
  /* excluded.* columns of type REAL need to be converted to a hard real */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
      sqlite3VdbeAddOp1(v, OP_RealAffinity, pTop->regData+i);
    }
  }
  sqlite3Update(pParse, pSrc, sqlite3ExprListDup(db,pUpsert->pUpsertSet,0),
      sqlite3ExprDup(db,pUpsert->pUpsertWhere,0), OE_Abort, 0, 0, pUpsert);
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}